

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

void learn<true>(bfgs *b,base_learner *base,example *ec)

{
  bool bVar1;
  example *in_RDX;
  bfgs *in_RSI;
  undefined8 *in_RDI;
  example *unaff_retaddr;
  vw *all;
  example *ec_00;
  
  ec_00 = (example *)*in_RDI;
  if ((ulong)in_RDI[0x13] <= (ulong)in_RDI[3]) {
    bVar1 = test_example(in_RDX);
    if (bVar1) {
      predict<true>(in_RSI,(base_learner *)in_RDX,ec_00);
    }
    else {
      process_example((vw *)ec,(bfgs *)all,unaff_retaddr);
    }
  }
  return;
}

Assistant:

void learn(bfgs& b, base_learner& base, example& ec)
{
  vw* all = b.all;
  assert(ec.in_use);

  if (b.current_pass <= b.final_pass)
  {
    if (test_example(ec))
      predict<audit>(b, base, ec);
    else
      process_example(*all, b, ec);
  }
}